

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O3

void __thiscall
anurbs::NurbsSurfaceGeometry<3L>::set_knots_u
          (NurbsSurfaceGeometry<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value)

{
  PointerType pdVar1;
  double *pdVar2;
  PointerType pdVar3;
  ulong size_00;
  double *pdVar4;
  double dVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  Index size;
  
  pdVar3 = (value->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  size_00 = (value->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
  if ((this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != size_00) {
    if ((long)size_00 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_u,size_00,size_00,1);
    if ((this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != size_00) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2d1,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  uVar6 = size_00 - ((long)size_00 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)size_00) {
    lVar7 = 0;
    do {
      pdVar1 = pdVar3 + lVar7;
      dVar5 = pdVar1[1];
      pdVar2 = pdVar4 + lVar7;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar5;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar6);
  }
  if ((long)uVar6 < (long)size_00) {
    do {
      pdVar4[uVar6] = pdVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (size_00 != uVar6);
  }
  return;
}

Assistant:

void set_knots_u(Eigen::Ref<const Eigen::VectorXd> value)
    {
        m_knots_u = value;
    }